

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall IRT::PrintVisitor::AddArrow(PrintVisitor *this,int child_id)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  string __str_1;
  string __str;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  uVar11 = this->lastVisited + 1;
  uVar9 = -uVar11;
  if (0 < (int)uVar11) {
    uVar9 = uVar11;
  }
  uVar10 = 1;
  if (9 < uVar9) {
    uVar8 = (ulong)uVar9;
    uVar5 = 4;
    do {
      uVar10 = uVar5;
      uVar4 = (uint)uVar8;
      if (uVar4 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0012f867;
      }
      if (uVar4 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0012f867;
      }
      if (uVar4 < 10000) goto LAB_0012f867;
      uVar8 = uVar8 / 10000;
      uVar5 = uVar10 + 4;
    } while (99999 < uVar4);
    uVar10 = uVar10 + 1;
  }
LAB_0012f867:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar10 - (char)((int)uVar11 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0] + (uVar11 >> 0x1f),uVar10,uVar9);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x15a419);
  local_90 = &local_80;
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar2[3];
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar7 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar7) {
    local_c0 = *puVar7;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar7;
    local_d0 = (ulong *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)puVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  uVar9 = -child_id;
  if (0 < child_id) {
    uVar9 = child_id;
  }
  uVar11 = 1;
  if (9 < uVar9) {
    uVar8 = (ulong)uVar9;
    uVar10 = 4;
    do {
      uVar11 = uVar10;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_0012f9b7;
      }
      if (uVar5 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_0012f9b7;
      }
      if (uVar5 < 10000) goto LAB_0012f9b7;
      uVar8 = uVar8 / 10000;
      uVar10 = uVar11 + 4;
    } while (99999 < uVar5);
    uVar11 = uVar11 + 1;
  }
LAB_0012f9b7:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar11 - (char)(child_id >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)child_id >> 0x1f) + (long)local_b0),uVar11,uVar9);
  uVar8 = 0xf;
  if (local_d0 != &local_c0) {
    uVar8 = local_c0;
  }
  if (uVar8 < (ulong)(local_a8 + local_c8)) {
    uVar8 = 0xf;
    if (local_b0 != local_a0) {
      uVar8 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_c8) <= uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0012fa43;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_0012fa43:
  local_f0 = &local_e0;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar3[3];
  }
  else {
    local_e0 = *puVar1;
    local_f0 = (undefined8 *)*puVar3;
  }
  local_e8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&this->description,(ulong)local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void IRT::PrintVisitor::AddArrow( int child_id ) {
    this->description += "\t" + std::to_string( lastVisited + 1 ) + " -> " + std::to_string( child_id ) + "\n";
}